

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O1

duckdb_state
duckdb_prepare(duckdb_connection connection,char *query,
              duckdb_prepared_statement *out_prepared_statement)

{
  undefined1 auVar1 [8];
  bool bVar2;
  duckdb_state dVar3;
  duckdb_prepared_statement p_Var4;
  size_t sVar5;
  pointer this;
  pointer *__ptr;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  
  dVar3 = DuckDBError;
  if (out_prepared_statement != (duckdb_prepared_statement *)0x0 &&
      (query != (char *)0x0 && connection != (duckdb_connection)0x0)) {
    p_Var4 = (duckdb_prepared_statement)operator_new(0x40);
    *(undefined8 *)p_Var4 = 0;
    *(undefined8 *)(p_Var4 + 8) = 0;
    *(undefined8 *)(p_Var4 + 0x20) = 0;
    *(undefined8 *)(p_Var4 + 0x28) = 0;
    *(undefined8 *)(p_Var4 + 0x30) = 0;
    *(undefined8 *)(p_Var4 + 0x38) = 0;
    *(undefined8 *)(p_Var4 + 0x10) = 0;
    *(undefined8 *)(p_Var4 + 0x18) = 0;
    *(duckdb_prepared_statement *)p_Var4 = p_Var4 + 0x30;
    *(undefined8 *)(p_Var4 + 8) = 1;
    *(undefined4 *)(p_Var4 + 0x20) = 0x3f800000;
    *(undefined8 *)(p_Var4 + 0x28) = 0;
    *(undefined8 *)(p_Var4 + 0x30) = 0;
    *(undefined8 *)(p_Var4 + 0x38) = 0;
    local_50._M_pi = &local_40;
    sVar5 = strlen(query);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,query,query + sVar5);
    duckdb::Connection::Prepare((Connection *)local_58,(string *)connection);
    auVar1 = local_58;
    local_58 = (undefined1  [8])0x0;
    std::__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
    ::reset((__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
             *)(p_Var4 + 0x38),(pointer)auVar1);
    auVar1 = local_58;
    if (local_58 != (undefined1  [8])0x0) {
      duckdb::PreparedStatement::~PreparedStatement((PreparedStatement *)local_58);
      operator_delete((void *)auVar1);
    }
    local_58 = (undefined1  [8])0x0;
    if (local_50._M_pi != &local_40) {
      operator_delete(local_50._M_pi);
    }
    *out_prepared_statement = p_Var4;
    this = duckdb::
           unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
           ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                         *)(p_Var4 + 0x38));
    bVar2 = duckdb::PreparedStatement::HasError(this);
    dVar3 = (duckdb_state)bVar2;
  }
  return dVar3;
}

Assistant:

duckdb_state duckdb_prepare(duckdb_connection connection, const char *query,
                            duckdb_prepared_statement *out_prepared_statement) {
	if (!connection || !query || !out_prepared_statement) {
		return DuckDBError;
	}
	auto wrapper = new PreparedStatementWrapper();
	Connection *conn = reinterpret_cast<Connection *>(connection);
	wrapper->statement = conn->Prepare(query);
	*out_prepared_statement = reinterpret_cast<duckdb_prepared_statement>(wrapper);
	return !wrapper->statement->HasError() ? DuckDBSuccess : DuckDBError;
}